

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

Class class_setSuperclass(Class cls,Class newSuper)

{
  BOOL BVar1;
  mutex_t *local_60;
  mutex_t *lock_pointer2;
  Class newSuperMeta;
  Class meta;
  uint local_34;
  mutex_t *local_30;
  mutex_t *lock_pointer1;
  Class oldSuper;
  Class newSuper_local;
  Class cls_local;
  
  if (cls == (Class)0x0) {
    cls_local = (Class)0x0;
  }
  else if (newSuper == (Class)0x0) {
    cls_local = (Class)0x0;
  }
  else if (cls == (Class)0x0) {
    cls_local = (Class)0x0;
  }
  else {
    local_30 = &runtime_mutex;
    oldSuper = newSuper;
    newSuper_local = cls;
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    lock_pointer1 = (mutex_t *)newSuper_local->super_class;
    if (lock_pointer1 == (mutex_t *)oldSuper) {
      cls_local = oldSuper;
      local_34 = 1;
    }
    else {
      safe_remove_from_subclass_list(newSuper_local);
      objc_resolve_class(oldSuper);
      newSuper_local->super_class = oldSuper;
      newSuper_local->sibling_class = newSuper_local->super_class->subclass_list;
      newSuper_local->super_class->subclass_list = newSuper_local;
      BVar1 = class_isMetaClass(newSuper_local);
      if (BVar1 == '\0') {
        newSuperMeta = newSuper_local->isa;
        lock_pointer2 = (mutex_t *)oldSuper->isa;
        safe_remove_from_subclass_list(newSuperMeta);
        objc_resolve_class((Class)&lock_pointer2->__data);
        newSuperMeta->super_class = (Class)lock_pointer2;
        newSuperMeta->isa = (Class)lock_pointer2->__align;
        newSuperMeta->sibling_class = *(Class *)((long)lock_pointer2 + 0x48);
        *(Class *)((long)lock_pointer2 + 0x48) = newSuperMeta;
      }
      else {
        newSuper_local->isa = oldSuper->isa;
      }
      local_60 = &initialize_lock;
      pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
      BVar1 = objc_test_class_flag(newSuper_local,objc_class_flag_initialized);
      if (BVar1 == '\0') {
        cls_local = (Class)&lock_pointer1->__data;
      }
      local_34 = (uint)(BVar1 == '\0');
      objc_release_lock(&local_60);
    }
    objc_release_lock(&local_30);
    if (local_34 == 0) {
      objc_send_initialize((id)oldSuper);
      objc_update_dtable_for_new_superclass(newSuper_local->isa,oldSuper->isa);
      objc_update_dtable_for_new_superclass(newSuper_local,oldSuper);
      cls_local = (Class)&lock_pointer1->__data;
    }
  }
  return cls_local;
}

Assistant:

__attribute__((deprecated))
Class class_setSuperclass(Class cls, Class newSuper)
{
	CHECK_ARG(cls);
	CHECK_ARG(newSuper);
	Class oldSuper;
	if (Nil == cls) { return Nil; }

	{
		LOCK_RUNTIME_FOR_SCOPE();

		oldSuper = cls->super_class;

		if (oldSuper == newSuper) { return newSuper; }

		safe_remove_from_subclass_list(cls);
		objc_resolve_class(newSuper);

		cls->super_class = newSuper;

		// The super class's subclass list is used in certain method resolution scenarios.
		cls->sibling_class = cls->super_class->subclass_list;
		cls->super_class->subclass_list = cls;

		if (UNLIKELY(class_isMetaClass(cls)))
		{
			// newSuper is presumably a metaclass. Its isa will therefore be the appropriate root metaclass.
			cls->isa = newSuper->isa;
		}
		else
		{
			Class meta = cls->isa, newSuperMeta = newSuper->isa;
			// Update the metaclass's superclass.
			safe_remove_from_subclass_list(meta);
			objc_resolve_class(newSuperMeta);

			meta->super_class = newSuperMeta;
			meta->isa = newSuperMeta->isa;

			// The super class's subclass list is used in certain method resolution scenarios.
			meta->sibling_class = newSuperMeta->subclass_list;
			newSuperMeta->subclass_list = meta;
		}

		LOCK_FOR_SCOPE(&initialize_lock);
		if (!objc_test_class_flag(cls, objc_class_flag_initialized))
		{
			// Uninitialized classes don't have dtables to update
			// and don't need their superclasses initialized.
			return oldSuper;
		}
	}

	objc_send_initialize((id)newSuper); // also initializes the metaclass
	objc_update_dtable_for_new_superclass(cls->isa, newSuper->isa);
	objc_update_dtable_for_new_superclass(cls, newSuper);

	return oldSuper;
}